

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O0

FT_Bool tt_face_get_paint_layers
                  (TT_Face face,FT_LayerIterator *iterator,FT_OpaquePaint *opaque_paint)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  void *pvVar5;
  byte *pbVar6;
  FT_Byte *pFVar7;
  Colr *colr;
  FT_UInt32 paint_offset;
  FT_Byte *p_paint;
  FT_Byte *p_first_layer;
  FT_Byte *p;
  FT_OpaquePaint *opaque_paint_local;
  FT_LayerIterator *iterator_local;
  TT_Face face_local;
  
  if (iterator->layer == iterator->num_layers) {
    face_local._7_1_ = '\0';
  }
  else {
    pvVar5 = face->colr;
    if (pvVar5 == (void *)0x0) {
      face_local._7_1_ = '\0';
    }
    else {
      pbVar6 = iterator->p;
      if (pbVar6 + (-4 - (ulong)(iterator->layer << 2)) < *(byte **)((long)pvVar5 + 0x30)) {
        face_local._7_1_ = '\0';
      }
      else if (pbVar6 + (-4 - (ulong)(iterator->layer << 2)) <
               (byte *)(*(long *)((long)pvVar5 + 0x30) + 4 + *(long *)((long)pvVar5 + 0x28) * 4)) {
        if ((pbVar6 < *(byte **)((long)pvVar5 + 0x30)) ||
           ((byte *)(*(long *)((long)pvVar5 + 0x80) + *(long *)((long)pvVar5 + 0x88) + -4) < pbVar6)
           ) {
          face_local._7_1_ = '\0';
        }
        else {
          bVar1 = *pbVar6;
          bVar2 = pbVar6[1];
          bVar3 = pbVar6[2];
          bVar4 = pbVar6[3];
          opaque_paint->insert_root_transform = '\0';
          pFVar7 = (FT_Byte *)
                   (*(long *)((long)pvVar5 + 0x30) +
                   (ulong)((uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 |
                          (uint)bVar4));
          if ((pFVar7 < *(FT_Byte **)((long)pvVar5 + 0x40)) ||
             ((FT_Byte *)(*(long *)((long)pvVar5 + 0x80) + *(long *)((long)pvVar5 + 0x88)) <= pFVar7
             )) {
            face_local._7_1_ = '\0';
          }
          else {
            opaque_paint->p = pFVar7;
            iterator->p = pbVar6 + 4;
            iterator->layer = iterator->layer + 1;
            face_local._7_1_ = '\x01';
          }
        }
      }
      else {
        face_local._7_1_ = '\0';
      }
    }
  }
  return face_local._7_1_;
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_paint_layers( TT_Face            face,
                            FT_LayerIterator*  iterator,
                            FT_OpaquePaint*    opaque_paint )
  {
    FT_Byte*   p             = NULL;
    FT_Byte*   p_first_layer = NULL;
    FT_Byte*   p_paint       = NULL;
    FT_UInt32  paint_offset;

    Colr*  colr;


    if ( iterator->layer == iterator->num_layers )
      return 0;

    colr = (Colr*)face->colr;
    if ( !colr )
      return 0;

    /*
     * We have an iterator pointing at a paint offset as part of the
     * `paintOffset` array in `LayerV1List`.
     */
    p = iterator->p;

    /*
     * Do a cursor sanity check of the iterator.  Counting backwards from
     * where it stands, we need to end up at a position after the beginning
     * of the `LayerV1List` table and not after the end of the
     * `LayerV1List`.
     */
    p_first_layer = p -
                      iterator->layer * LAYER_V1_LIST_PAINT_OFFSET_SIZE -
                      LAYER_V1_LIST_NUM_LAYERS_SIZE;
    if ( p_first_layer < (FT_Byte*)colr->layers_v1 )
      return 0;
    if ( p_first_layer >= (FT_Byte*)(
           colr->layers_v1 + LAYER_V1_LIST_NUM_LAYERS_SIZE +
           colr->num_layers_v1 * LAYER_V1_LIST_PAINT_OFFSET_SIZE ) )
      return 0;

    /*
     * Before reading, ensure that `p` is within 'COLR' v1 and we can read a
     * 4-byte ULONG.
     */
    if ( p < colr->layers_v1                              ||
         p > (FT_Byte*)colr->table + colr->table_size - 4 )
      return 0;

    paint_offset =
      FT_NEXT_ULONG( p );
    opaque_paint->insert_root_transform =
      0;

    p_paint = (FT_Byte*)( colr->layers_v1 + paint_offset );

    if ( p_paint < colr->paints_start_v1                         ||
         p_paint >= ( (FT_Byte*)colr->table + colr->table_size ) )
      return 0;

    opaque_paint->p = p_paint;

    iterator->p = p;

    iterator->layer++;

    return 1;
  }